

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_skeleton_blocker_complex.cpp
# Opt level: O2

void __thiscall
test_skeleton_blocker_complex_link6::test_method(test_skeleton_blocker_complex_link6 *this)

{
  ostream *poVar1;
  string local_230;
  undefined1 local_210;
  undefined8 local_208;
  shared_count sStack_200;
  Simplex alpha;
  char *local_1b8;
  char *local_1b0;
  undefined1 *local_1a8;
  undefined1 *local_1a0;
  char *local_198;
  char *local_190;
  Skeleton_blocker_link_complex link_blocker_alpha;
  Complex complex;
  
  Gudhi::skeleton_blocker::
  Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>::
  Skeleton_blocker_complex(&complex,0,(Visitor *)0x0);
  build_complete(4,&complex);
  Gudhi::skeleton_blocker::
  Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>::
  Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>
            ((Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>
              *)&link_blocker_alpha,(Vertex_handle)0x0,(Vertex_handle)0x1,(Vertex_handle)0x2);
  Gudhi::skeleton_blocker::
  Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>::add_blocker
            (&complex,(Simplex *)&link_blocker_alpha);
  std::
  _Rb_tree<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_std::_Identity<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>,_std::less<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>,_std::allocator<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_>
  ::~_Rb_tree((_Rb_tree<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_std::_Identity<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>,_std::less<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>,_std::allocator<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_>
               *)&link_blocker_alpha);
  Gudhi::skeleton_blocker::
  Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>::
  Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>
            (&alpha,(Vertex_handle)0x0,(Vertex_handle)0x1,(Vertex_handle)0x2);
  Gudhi::skeleton_blocker::
  Skeleton_blocker_link_complex<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>_>
  ::Skeleton_blocker_link_complex(&link_blocker_alpha,false);
  Gudhi::skeleton_blocker::build_link_of_blocker(&complex,&alpha,&link_blocker_alpha);
  poVar1 = std::operator<<((ostream *)&std::clog,"Complex: ");
  Gudhi::skeleton_blocker::
  Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>::
  to_string_abi_cxx11_(&local_230,&complex);
  poVar1 = std::operator<<(poVar1,(string *)&local_230);
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::~string((string *)&local_230);
  poVar1 = std::operator<<((ostream *)&std::clog,"Link: ");
  Gudhi::skeleton_blocker::
  Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>::
  to_string_abi_cxx11_
            (&local_230,
             (Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits> *)
             &link_blocker_alpha);
  poVar1 = std::operator<<(poVar1,(string *)&local_230);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::~string((string *)&local_230);
  local_198 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Skeleton_blocker/test/test_skeleton_blocker_complex.cpp"
  ;
  local_190 = "";
  local_1a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1a0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_198,0x22c);
  local_210 = (int)link_blocker_alpha.
                   super_Skeleton_blocker_sub_complex<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>_>
                   .
                   super_Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>
                   .num_vertices_ == 1;
  local_208 = 0;
  sStack_200.pi_ = (sp_counted_base *)0x0;
  local_230.field_2._8_8_ = &local_1b8;
  local_1b8 = "link_blocker_alpha.num_vertices() == 1";
  local_1b0 = "";
  local_230._M_string_length._0_1_ = 0;
  local_230._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_00132bb8;
  local_230.field_2._M_allocated_capacity = (size_type)&boost::unit_test::lazy_ostream::inst;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_200);
  Gudhi::skeleton_blocker::
  Skeleton_blocker_sub_complex<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>_>
  ::~Skeleton_blocker_sub_complex
            (&link_blocker_alpha.
              super_Skeleton_blocker_sub_complex<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>_>
            );
  std::
  _Rb_tree<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_std::_Identity<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>,_std::less<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>,_std::allocator<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_>
  ::~_Rb_tree((_Rb_tree<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_std::_Identity<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>,_std::less<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>,_std::allocator<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_>
               *)&alpha);
  Gudhi::skeleton_blocker::
  Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>::
  ~Skeleton_blocker_complex(&complex);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(test_skeleton_blocker_complex_link6) {
  Complex complex(0);
  // Build the complexes
  build_complete(4, complex);
  complex.add_blocker(Simplex(Vertex_handle(0), Vertex_handle(1), Vertex_handle(2)));

  Simplex alpha(Vertex_handle(0), Vertex_handle(1), Vertex_handle(2));

  Skeleton_blocker_link_complex link_blocker_alpha;

  build_link_of_blocker(complex, alpha, link_blocker_alpha);

  // Print result
  std::clog << "Complex: " << complex.to_string()<< std::endl << std::endl;
  std::clog << "Link: " << link_blocker_alpha.to_string() << std::endl;

  // verification
  BOOST_CHECK(link_blocker_alpha.num_vertices() == 1);
}